

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O1

int AF_A_RocketInFlight(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  PClassActor *pPVar7;
  AActor *pAVar8;
  uint uVar9;
  VMValue *pVVar10;
  char *__assertion;
  bool bVar11;
  FSoundID local_64;
  DAngle local_60;
  DAngle local_58;
  DVector2 v;
  DVector3 local_40;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005d1808;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    pAVar8 = (AActor *)(param->field_0).field_1.a;
    pVVar10 = param;
    uVar9 = numparam;
    if (pAVar8 != (AActor *)0x0) {
      if ((pAVar8->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
        (pAVar8->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar6 = (pAVar8->super_DThinker).super_DObject.Class;
      bVar11 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar9 = (uint)bVar11;
      pVVar10 = (VMValue *)(ulong)(pPVar6 == pPVar3 || bVar11);
      if (pPVar6 != pPVar3 && !bVar11) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d1808;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d17dd;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar5 = (**(code **)*puVar2)(puVar2,pVVar10,uVar9,ret);
          puVar2[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar2[1];
        bVar11 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar11) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar11 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d1808;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_64.ID = S_FindSound("misc/missileinflight");
      S_Sound(pAVar8,2,&local_64,1.0,1.0);
      pPVar7 = PClass::FindActor("MiniMissilePuff");
      local_40.X = (pAVar8->__Pos).X;
      local_40.Y = (pAVar8->__Pos).Y;
      local_40.Z = (pAVar8->__Pos).Z;
      local_60.Degrees = (pAVar8->Angles).Yaw.Degrees + -180.0;
      local_58.Degrees = local_60.Degrees;
      P_SpawnPuff(pAVar8,pPVar7,&local_40,&local_58,&local_60,2,1,(AActor *)0x0);
      iVar4 = FName::NameManager::FindName(&FName::NameData,"RocketTrail",false);
      P_GetOffsetPosition((pAVar8->__Pos).X,(pAVar8->__Pos).Y,-(pAVar8->Vel).X,-(pAVar8->Vel).Y);
      local_40.Z = (pAVar8->__Pos).Z + 0.0;
      local_40.Y = v.Y;
      v.X._0_4_ = iVar4;
      pPVar7 = ClassForSpawn((FName *)&v);
      pAVar8 = AActor::StaticSpawn(pPVar7,&local_40,ALLOW_REPLACE,false);
      if (pAVar8 != (AActor *)0x0) {
        (pAVar8->Vel).Z = 1.0;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d17dd:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d1808:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x179,"int AF_A_RocketInFlight(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RocketInFlight)
{
	PARAM_ACTION_PROLOGUE;

	AActor *trail;

	S_Sound (self, CHAN_VOICE, "misc/missileinflight", 1, ATTN_NORM);
	P_SpawnPuff (self, PClass::FindActor("MiniMissilePuff"), self->Pos(), self->Angles.Yaw - 180, self->Angles.Yaw - 180, 2, PF_HITTHING);
	trail = Spawn("RocketTrail", self->Vec3Offset(-self->Vel.X, -self->Vel.Y, 0.), ALLOW_REPLACE);
	if (trail != NULL)
	{
		trail->Vel.Z = 1;
	}
	return 0;
}